

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O0

void __thiscall
booster::locale::boundary::details::
segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
::update_current(segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *this,pair<unsigned_long,_unsigned_long> pos)

{
  segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *this_00;
  size_t sVar1;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *__i;
  segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *this_01;
  long __n;
  long in_RDI;
  ptrdiff_t second_diff;
  ptrdiff_t first_diff;
  size_t in_stack_ffffffffffffffc0;
  segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *in_stack_ffffffffffffffc8;
  pair<unsigned_long,_unsigned_long> local_10;
  
  this_00 = (segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)get_offset(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  sVar1 = get_offset(in_stack_ffffffffffffffc8,(size_t)this_00);
  __i = (__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
         *)((long)this_00 - sVar1);
  this_01 = (segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)get_offset(in_stack_ffffffffffffffc8,(size_t)this_00);
  sVar1 = get_offset(this_01,(size_t)this_00);
  __n = (long)this_01 - sVar1;
  std::advance<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,long>(__i,__n);
  std::advance<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,long>(__i,__n);
  std::pair<unsigned_long,_unsigned_long>::operator=
            ((pair<unsigned_long,_unsigned_long> *)(in_RDI + 0x18),&local_10);
  update_rule(this_00);
  return;
}

Assistant:

void update_current(std::pair<size_t,size_t> pos)
                    {
                        std::ptrdiff_t first_diff = get_offset(pos.first) - get_offset(current_.first);
                        std::ptrdiff_t second_diff = get_offset(pos.second) - get_offset(current_.second);
                        std::advance(value_.first,first_diff);
                        std::advance(value_.second,second_diff);
                        current_ = pos;
                        update_rule();
                    }